

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdiSubWindow::mouseDoubleClickEvent(QMdiSubWindow *this,QMouseEvent *mouseEvent)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  if (*(long *)(lVar2 + 0x10) == 0) {
    QWidget::mouseDoubleClickEvent(&this->super_QWidget,mouseEvent);
    return;
  }
  if (*(int *)(mouseEvent + 0x40) == 1) {
    if (*(int *)(lVar2 + 0x2ec) == 1) {
      uVar1 = (((this->super_QWidget).data)->window_flags).
              super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i;
      bVar3 = QWidget::isMinimized(&this->super_QWidget);
      if (bVar3) {
        if (((byte)((uVar1 >> 0x11 & 1) == 0 |
                   *(byte *)(*(long *)&(this->super_QWidget).field_0x8 + 0x2d4) ^ 1) != 1) ||
           ((uVar1 & 0x4000) != 0)) {
LAB_0045181a:
          QWidget::showNormal(&this->super_QWidget);
          return;
        }
      }
      else {
        bVar3 = QWidget::isMaximized(&this->super_QWidget);
        if (bVar3) {
          if ((short)uVar1 < 0) goto LAB_0045181a;
        }
        else {
          if ((uVar1 >> 0x11 & 1) != 0) {
            showShaded(this);
            return;
          }
          if ((short)uVar1 < 0) {
            QWidget::showMaximized(&this->super_QWidget);
            return;
          }
        }
      }
    }
    else if (*(int *)(lVar2 + 0x2f0) == 1) {
      QWidget::close(&this->super_QWidget,(int)mouseEvent);
      return;
    }
  }
  else {
    mouseEvent[0xc] = (QMouseEvent)0x0;
  }
  return;
}

Assistant:

void QMdiSubWindow::mouseDoubleClickEvent(QMouseEvent *mouseEvent)
{
    if (!parent()) {
        QWidget::mouseDoubleClickEvent(mouseEvent);
        return;
    }

    if (mouseEvent->button() != Qt::LeftButton) {
        mouseEvent->ignore();
        return;
    }

    Q_D(QMdiSubWindow);
    if (!d->isMoveOperation()) {
#if QT_CONFIG(menu)
        if (d->hoveredSubControl == QStyle::SC_TitleBarSysMenu)
            close();
#endif
        return;
    }

    Qt::WindowFlags flags = windowFlags();
    if (isMinimized()) {
        if ((isShaded() && (flags & Qt::WindowShadeButtonHint))
            || (flags & Qt::WindowMinimizeButtonHint)) {
            showNormal();
        }
        return;
    }

    if (isMaximized()) {
       if (flags & Qt::WindowMaximizeButtonHint)
           showNormal();
       return;
    }

    if (flags & Qt::WindowShadeButtonHint)
        showShaded();
    else if (flags & Qt::WindowMaximizeButtonHint)
        showMaximized();
}